

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

size_t uv_test_fs_buf_offset(uv_buf_t *bufs,size_t size)

{
  bool bVar1;
  size_t local_20;
  size_t offset;
  size_t size_local;
  uv_buf_t *bufs_local;
  
  local_20 = 0;
  offset = size;
  while( true ) {
    bVar1 = false;
    if (offset != 0) {
      bVar1 = bufs[local_20].len <= offset;
    }
    if (!bVar1) break;
    offset = offset - bufs[local_20].len;
    local_20 = local_20 + 1;
  }
  if (offset != 0) {
    bufs[local_20].base = bufs[local_20].base + offset;
    bufs[local_20].len = bufs[local_20].len - offset;
  }
  return local_20;
}

Assistant:

static size_t uv_test_fs_buf_offset(uv_buf_t* bufs, size_t size) {
  size_t offset;
  /* Figure out which bufs are done */
  for (offset = 0; size > 0 && bufs[offset].len <= size; ++offset)
    size -= bufs[offset].len;

  /* Fix a partial read/write */
  if (size > 0) {
    bufs[offset].base += size;
    bufs[offset].len -= size;
  }
  return offset;
}